

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O0

int cram_index_build_multiref
              (cram_fd *fd,cram_container *c,cram_slice *s,zfp *fp,off_t cpos,int32_t landmark,
              int sz)

{
  int iVar1;
  char local_458 [8];
  char buf [1024];
  int local_4c;
  uint local_48;
  int ref_end;
  int ref_start;
  int ref;
  int i;
  int32_t landmark_local;
  off_t cpos_local;
  zfp *fp_local;
  cram_slice *s_local;
  cram_container *c_local;
  cram_fd *fd_local;
  
  ref_end = -2;
  local_48 = 0;
  iVar1 = cram_decode_slice(fd,c,s,fd->header);
  if (iVar1 == 0) {
    local_4c = -0x80000000;
    for (ref_start = 0; ref_start < s->hdr->num_records; ref_start = ref_start + 1) {
      if (s->crecs[ref_start].ref_id == ref_end) {
        if (local_4c < s->crecs[ref_start].aend) {
          local_4c = s->crecs[ref_start].aend;
        }
      }
      else {
        if (ref_end != -2) {
          sprintf(local_458,"%d\t%d\t%d\t%ld\t%d\t%d\n",(ulong)(uint)ref_end,(ulong)local_48,
                  (ulong)((local_4c - local_48) + 1),cpos,landmark,sz);
          zfputs(local_458,fp);
        }
        ref_end = s->crecs[ref_start].ref_id;
        local_48 = s->crecs[ref_start].apos;
        local_4c = -0x80000000;
      }
    }
    if (ref_end != -2) {
      sprintf(local_458,"%d\t%d\t%d\t%ld\t%d\t%d\n",(ulong)(uint)ref_end,(ulong)local_48,
              (ulong)((local_4c - local_48) + 1),cpos,landmark,sz);
      zfputs(local_458,fp);
    }
    fd_local._4_4_ = 0;
  }
  else {
    fd_local._4_4_ = -1;
  }
  return fd_local._4_4_;
}

Assistant:

static int cram_index_build_multiref(cram_fd *fd,
				     cram_container *c,
				     cram_slice *s,
				     zfp *fp,
				     off_t cpos,
				     int32_t landmark,
				     int sz) {
    int i, ref = -2, ref_start = 0, ref_end;
    char buf[1024];

    if (0 != cram_decode_slice(fd, c, s, fd->header))
	return -1;

    ref_end = INT_MIN;
    for (i = 0; i < s->hdr->num_records; i++) {
	if (s->crecs[i].ref_id == ref) {
	    if (ref_end < s->crecs[i].aend)
		ref_end = s->crecs[i].aend;
	    continue;
	}

	if (ref != -2) {
	    sprintf(buf, "%d\t%d\t%d\t%"PRId64"\t%d\t%d\n",
		    ref, ref_start, ref_end - ref_start + 1,
		    (int64_t)cpos, landmark, sz);
	    zfputs(buf, fp);
	}

	ref = s->crecs[i].ref_id;
	ref_start = s->crecs[i].apos;
	ref_end = INT_MIN;
    }

    if (ref != -2) {
	sprintf(buf, "%d\t%d\t%d\t%"PRId64"\t%d\t%d\n",
		ref, ref_start, ref_end - ref_start + 1,
		(int64_t)cpos, landmark, sz);
	zfputs(buf, fp);
    }

    return 0;
}